

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcode.c
# Opt level: O1

int sizei(Instruction *i)

{
  int iVar1;
  byte bVar2;
  
  bVar2 = (i->i).code - 2;
  iVar1 = 1;
  if (bVar2 < 0xf) {
    iVar1 = *(int *)(&DAT_0014d98c + (ulong)bVar2 * 4);
  }
  return iVar1;
}

Assistant:

int sizei (const Instruction *i) {
  switch((Opcode)i->i.code) {
    case ISet: case ISpan: return CHARSETINSTSIZE;
    case ITestSet: return CHARSETINSTSIZE + 1;
    case ITestChar: case ITestAny: case IChoice: case IJmp: case ICall:
    case IOpenCall: case ICommit: case IPartialCommit: case IBackCommit:
      return 2;
    default: return 1;
  }
}